

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

vector<Card,_std::allocator<Card>_> * __thiscall
Game::getValidCards(vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Game *this,
                   size_t playerID,Card *c)

{
  bool bVar1;
  reference this_00;
  reference pCVar2;
  Card local_60;
  Card card;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  Card *c_local;
  size_t playerID_local;
  Game *this_local;
  vector<Card,_std::allocator<Card>_> *validCards;
  
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Card,_std::allocator<Card>_>::vector(__return_storage_ptr__);
  this_00 = std::
            vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
            ::at(&this->m_playerCards,playerID);
  __end1 = std::vector<Card,_std::allocator<Card>_>::begin(this_00);
  card = (Card)std::vector<Card,_std::allocator<Card>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>
                                     *)&card), bVar1) {
    pCVar2 = __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::
             operator*(&__end1);
    local_60 = *pCVar2;
    bVar1 = checkValidCard(this,playerID,*c,local_60);
    if (bVar1) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,&local_60);
    }
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> Game::getValidCards(size_t playerID, Card &c) {
    std::vector<Card> validCards = std::vector<Card>();
    for (Card card : m_playerCards.at(playerID)) {
        if (checkValidCard(playerID, c, card))
            validCards.push_back(card);
    }
    return validCards;
}